

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O3

void __thiscall InputGraph::set_vertex_label(InputGraph *this,int v,string_view l)

{
  long lVar1;
  char *explanation;
  string_view name;
  
  explanation = l._M_str;
  name._M_str = "vertex label";
  name._M_len = (size_t)explanation;
  anon_unknown.dwarf_14212d::sanity_check_name
            ((anon_unknown_dwarf_14212d *)l._M_len,name,explanation);
  lVar1 = *(long *)&(((this->_imp)._M_t.
                      super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                      .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl)->vertex_labels)
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (lVar1 + (long)v * 0x20),0,*(size_type *)(lVar1 + 8 + (long)v * 0x20),explanation,
             (size_type)l._M_len);
  return;
}

Assistant:

auto InputGraph::set_vertex_label(int v, string_view l) -> void
{
    sanity_check_name(l, "vertex label");
    _imp->vertex_labels[v] = l;
}